

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QBGPlanner_TreeIncPruneBnB.cpp
# Opt level: O2

QFunctionsDiscrete * __thiscall
QBGPlanner_TreeIncPruneBnB::BackupStage
          (QFunctionsDiscrete *__return_storage_ptr__,QBGPlanner_TreeIncPruneBnB *this,
          QFunctionsDiscrete *Qs,size_t maxNrAlphas)

{
  Timing *this_00;
  VectorSet *VS;
  multi_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *pmVar1;
  DecPOMDPDiscreteInterface *pDVar2;
  multi_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *pmVar3;
  multi_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>_>
  *pmVar4;
  MultiAgentDecisionProcessDiscreteInterface *pMVar5;
  undefined1 auVar6 [16];
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  PlanningUnitDecPOMDPDiscrete *pPVar12;
  undefined8 uVar13;
  reference this_01;
  reference pvVar14;
  ostream *poVar15;
  undefined4 extraout_var;
  size_type __n;
  GaoVectorSetIndex a;
  ulong uVar16;
  uint i;
  GaoVectorSetIndex aPrime_1;
  Index ja;
  ulong uVar17;
  Index aPrime;
  uint uVar18;
  ulong uVar19;
  ulong __n_00;
  ulong uVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_XMM2 [16];
  ValueFunctionPOMDPDiscrete V;
  vector<AlphaVector,_std::allocator<AlphaVector>_> G;
  AlphaVector alpha;
  vector<AlphaVector,_std::allocator<AlphaVector>_> L;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  jpol;
  string local_258;
  GaoVectorSet Gao;
  AlphaVector v1;
  
  this->_m_nodes_visited = 0;
  this->_m_nr_bottom_hits = 0;
  this->_m_nr_backtracks = 0;
  Gao.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .base_ = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            **)0x0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)&v1,
             (ulong)this->_m_maxDepth,(value_type_conflict2 *)&Gao,(allocator_type *)&alpha);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::_M_move_assign
            (&this->_m_union_nodes_at_level,&v1);
  std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)&v1);
  Gao.
  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  .
  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
  .base_ = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            **)0x0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)&v1,
             (ulong)this->_m_maxDepth,(value_type_conflict2 *)&Gao,(allocator_type *)&alpha);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::_M_move_assign
            (&this->_m_cs_nodes_at_level,&v1);
  std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)&v1);
  AlphaVectorPlanning::QFunctionsToValueFunction(&V,Qs);
  pPVar12 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning._m_pu;
  if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar12 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
              _m_puShared.px;
  }
  sVar8 = PlanningUnitMADPDiscrete::GetNrStates(&pPVar12->super_PlanningUnitMADPDiscrete);
  pPVar12 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning._m_pu;
  if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar12 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
              _m_puShared.px;
  }
  uVar9 = (**(code **)((long)*(pPVar12->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  pPVar12 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning._m_pu;
  if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar12 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
              _m_puShared.px;
  }
  uVar10 = (**(code **)((long)*(pPVar12->super_PlanningUnitMADPDiscrete)._m_madp + 200))();
  std::operator<<((ostream *)&std::cout,
                  "TreeIncPruneBGPlanner::BackupStage computing all Gaoa vectors");
  std::ostream::flush();
  AlphaVectorPlanning::BackProject(&Gao,(AlphaVectorPlanning *)this,&V);
  for (uVar19 = 0; uVar19 != (uVar9 & 0xffffffff); uVar19 = uVar19 + 1) {
    for (uVar17 = 0; (uVar10 & 0xffffffff) != uVar17; uVar17 = uVar17 + 1) {
      VS = Gao.
           super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
           .
           super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
           .base_[Gao.
                  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                  .
                  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                  .origin_offset_ +
                  Gao.
                  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                  .
                  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                  .stride_list_.elems[0] * uVar19 +
                  Gao.
                  super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                  .
                  super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                  .stride_list_.elems[1] * uVar17];
      AlphaVectorPlanning::VectorSetToValueFunction((ValueFunctionPOMDPDiscrete *)&v1,VS,0,-1);
      pmVar1 = this->_m_Gao_storage;
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::_M_move_assign
                ((pmVar1->
                 super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>)
                 .
                 super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                 .base_ + (pmVar1->
                          super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                          ).
                          super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                          .origin_offset_ +
                          (pmVar1->
                          super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                          ).
                          super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                          .stride_list_.elems[0] * uVar19 +
                          (pmVar1->
                          super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                          ).
                          super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                          .stride_list_.elems[1] * uVar17,&v1);
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
                ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)&v1);
      boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
                (&VS->data_);
      operator_delete(VS,0x28);
    }
  }
  uVar19 = uVar9 & 0xffffffff;
  for (uVar17 = 0; uVar17 != uVar19; uVar17 = uVar17 + 1) {
    for (uVar16 = 0; uVar16 != (uVar10 & 0xffffffff); uVar16 = uVar16 + 1) {
      pPVar12 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning._m_pu;
      if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
        pPVar12 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
                  _m_puShared.px;
      }
      pDVar2 = pPVar12->_m_DecPOMDP;
      uVar20 = (**(code **)(*(long *)((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb0))
                           + 0x70))((long)&pDVar2->field_0x0 + *(long *)(*(long *)pDVar2 + -0xb0));
      uVar18 = 0;
      while( true ) {
        __n_00 = (ulong)uVar18;
        if (((long)V.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)V.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x28 == __n_00) break;
        pPVar12 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
                  _m_pu;
        if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
          pPVar12 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
                    _m_puShared.px;
        }
        sVar11 = PlanningUnitMADPDiscrete::GetNrStates(&pPVar12->super_PlanningUnitMADPDiscrete);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&alpha,sVar11,(allocator_type *)&v1);
        i = 0;
        while( true ) {
          pPVar12 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
                    _m_pu;
          if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
            pPVar12 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
                      _m_puShared.px;
          }
          sVar11 = PlanningUnitMADPDiscrete::GetNrStates(&pPVar12->super_PlanningUnitMADPDiscrete);
          if (sVar11 == i) break;
          pPVar12 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
                    _m_pu;
          if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
            pPVar12 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
                      _m_puShared.px;
          }
          dVar21 = (double)(**(code **)(*(long *)pPVar12->_m_DecPOMDP + 0xc0))
                                     (pPVar12->_m_DecPOMDP,i,uVar17 & 0xffffffff);
          pPVar12 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
                    _m_pu;
          if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
            pPVar12 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
                      _m_puShared.px;
          }
          uVar13 = (**(code **)((long)*(pPVar12->super_PlanningUnitMADPDiscrete)._m_madp + 200))();
          pmVar1 = this->_m_Gao_storage;
          this_01 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::at
                              ((pmVar1->
                               super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                               ).
                               super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                               .base_ + (pmVar1->
                                        super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                                        ).
                                        super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                                        .origin_offset_ +
                                        (pmVar1->
                                        super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                                        ).
                                        super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                                        .stride_list_.elems[0] * uVar17 +
                                        (pmVar1->
                                        super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                                        ).
                                        super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                                        .stride_list_.elems[1] * uVar16,__n_00);
          dVar22 = AlphaVector::GetValue(this_01,i);
          pvVar14 = std::vector<double,_std::allocator<double>_>::at
                              ((vector<double,_std::allocator<double>_> *)&alpha,(ulong)i);
          auVar6 = vcvtusi2sd_avx512f(in_XMM2,uVar13);
          i = i + 1;
          auVar23._0_8_ = dVar21 / auVar6._0_8_;
          auVar23._8_8_ = 0;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = dVar22;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar20;
          auVar6 = vfmadd132sd_fma(auVar24,auVar23,auVar6);
          *pvVar14 = auVar6._0_8_;
        }
        pPVar12 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
                  _m_pu;
        if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
          pPVar12 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
                    _m_puShared.px;
        }
        sVar11 = PlanningUnitMADPDiscrete::GetNrStates(&pPVar12->super_PlanningUnitMADPDiscrete);
        AlphaVector::AlphaVector(&v1,sVar11);
        AlphaVector::SetValues(&v1,(vector<double,_std::allocator<double>_> *)&alpha);
        pmVar3 = this->_m_Gaoa_storage;
        v1._m_action = (Index)uVar17;
        std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
                  ((pmVar3->
                   super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                   ).
                   super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                   .base_ + (pmVar3->
                            super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                            ).
                            super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                            .origin_offset_ +
                            (pmVar3->
                            super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                            ).
                            super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                            .stride_list_.elems[0] * uVar17 +
                            (pmVar3->
                            super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                            ).
                            super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                            .stride_list_.elems[1] * uVar16 +
                            (ulong)V.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>.
                                   _M_impl.super__Vector_impl_data._M_start[__n_00]._m_action *
                            (pmVar3->
                            super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                            ).
                            super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                            .stride_list_.elems[2],&v1);
        AlphaVector::~AlphaVector(&v1);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&alpha);
        uVar18 = uVar18 + 1;
      }
      for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
        pmVar3 = this->_m_Gaoa_storage;
        AlphaVectorPlanning::Prune
                  ((ValueFunctionPOMDPDiscrete *)&v1,(AlphaVectorPlanning *)this,
                   (pmVar3->
                   super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                   ).
                   super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                   .base_ + (pmVar3->
                            super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                            ).
                            super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                            .origin_offset_ +
                            (pmVar3->
                            super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                            ).
                            super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                            .stride_list_.elems[0] * uVar17 +
                            (pmVar3->
                            super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                            ).
                            super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                            .stride_list_.elems[1] * uVar16 +
                            (pmVar3->
                            super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                            ).
                            super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                            .stride_list_.elems[2] * uVar20);
        pmVar3 = this->_m_Gaoa_storage;
        std::vector<AlphaVector,_std::allocator<AlphaVector>_>::_M_move_assign
                  ((pmVar3->
                   super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                   ).
                   super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                   .base_ + (pmVar3->
                            super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                            ).
                            super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                            .origin_offset_ +
                            (pmVar3->
                            super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                            ).
                            super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                            .stride_list_.elems[0] * uVar17 +
                            (pmVar3->
                            super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                            ).
                            super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                            .stride_list_.elems[1] * uVar16 +
                            (pmVar3->
                            super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                            ).
                            super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                            .stride_list_.elems[2] * uVar20,&v1);
        std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
                  ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)&v1);
        pmVar3 = this->_m_Gaoa_storage;
        pmVar4 = this->_m_Gaoa;
        (pmVar4->
        super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>).
        super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
        .base_[(pmVar4->
               super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>)
               .
               super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
               .origin_offset_ +
               (pmVar4->
               super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>)
               .
               super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
               .stride_list_.elems[0] * uVar17 +
               (pmVar4->
               super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>)
               .
               super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
               .stride_list_.elems[1] * uVar16 +
               (pmVar4->
               super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>)
               .
               super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
               .stride_list_.elems[2] * uVar20] =
             (pmVar3->
             super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>).
             super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
             .base_ + (pmVar3->
                      super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                      ).
                      super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                      .origin_offset_ +
                      (pmVar3->
                      super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                      ).
                      super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                      .stride_list_.elems[0] * uVar17 +
                      (pmVar3->
                      super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                      ).
                      super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                      .stride_list_.elems[1] * uVar16 +
                      (pmVar3->
                      super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                      ).
                      super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                      .stride_list_.elems[2] * uVar20;
      }
    }
  }
  poVar15 = std::operator<<((ostream *)&std::cout," - total number of back-projected gamma vectors:"
                           );
  std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
  poVar15 = std::operator<<((ostream *)&std::cout,".");
  std::endl<char,std::char_traits<char>>(poVar15);
  AlphaVector::AlphaVector(&alpha,sVar8 & 0xffffffff);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector(__return_storage_ptr__,uVar19,(allocator_type *)&v1);
  uVar17 = 0;
  jpol.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  jpol.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  jpol.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    pPVar12 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning._m_pu;
    if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
      pPVar12 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
                _m_puShared.px;
    }
    iVar7 = (*(pPVar12->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[6])();
    if (CONCAT44(extraout_var,iVar7) == uVar17) break;
    pPVar12 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning._m_pu;
    if (pPVar12 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
      pPVar12 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
                _m_puShared.px;
    }
    pMVar5 = (pPVar12->super_PlanningUnitMADPDiscrete)._m_madp;
    __n = (**(code **)((long)*pMVar5 + 0xc0))(pMVar5,uVar17);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&v1,__n,&UNSPECIFIED_ACTION,
               (allocator_type *)&local_258);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_back(&jpol,(value_type *)&v1);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&v1);
    uVar17 = (ulong)((int)uVar17 + 1);
  }
  this_00 = &this->_m_timing;
  for (uVar17 = 0; uVar17 != (uVar9 & 0xffffffff); uVar17 = uVar17 + 1) {
    std::operator<<((ostream *)&std::cout,"\n\n--------------------------------------\n");
    poVar15 = std::operator<<((ostream *)&std::cout,"-proceeding with a=");
    poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
    std::operator<<(poVar15,"-------------------\n");
    std::operator<<((ostream *)&std::cout,"--------------------------------------\n\n");
    L.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    L.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    L.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::__cxx11::stringstream::stringstream((stringstream *)&v1);
    poVar15 = std::operator<<((ostream *)&v1._m_values,"ComputePOMDPheur_ts");
    std::ostream::operator<<
              ((ostream *)poVar15,
               *(int *)&(this->super_MonahanBGPlanner).super_MonahanPlanner.
                        super_AlphaVectorPlanning.field_0x12c);
    std::__cxx11::stringbuf::str();
    Timing::Start(this_00,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    ja = (Index)uVar17;
    InitializeHeuristicsForJA(this,ja);
    std::__cxx11::stringbuf::str();
    Timing::Stop(this_00,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::stringstream::~stringstream((stringstream *)&v1);
    poVar15 = std::operator<<((ostream *)&std::cout,"Heuristic initialized");
    std::endl<char,std::char_traits<char>>(poVar15);
    G.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    G.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    G.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    AlphaVector::AlphaVector(&v1,sVar8 & 0xffffffff,0.0);
    v1._m_action = ja;
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back(&G,&v1);
    UnionNode(this,ja,0,&jpol,&L,&G);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator=
              ((__return_storage_ptr__->
               super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar17,&L);
    SoftPrintStats_abi_cxx11_(&local_258,this);
    std::operator<<((ostream *)&std::cout,(string *)&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    AlphaVector::~AlphaVector(&v1);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&G);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&L);
  }
  for (uVar9 = 0; uVar9 != uVar19; uVar9 = uVar9 + 1) {
    for (uVar17 = 0; uVar17 != (uVar10 & 0xffffffff); uVar17 = uVar17 + 1) {
      pmVar1 = this->_m_Gao_storage;
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::clear
                ((pmVar1->
                 super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>)
                 .
                 super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                 .base_ + (pmVar1->
                          super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                          ).
                          super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                          .origin_offset_ +
                          (pmVar1->
                          super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                          ).
                          super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                          .stride_list_.elems[0] * uVar9 +
                          (pmVar1->
                          super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                          ).
                          super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                          .stride_list_.elems[1] * uVar17);
      for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
        pmVar3 = this->_m_Gaoa_storage;
        std::vector<AlphaVector,_std::allocator<AlphaVector>_>::clear
                  ((pmVar3->
                   super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                   ).
                   super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                   .base_ + (pmVar3->
                            super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                            ).
                            super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                            .origin_offset_ +
                            (pmVar3->
                            super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                            ).
                            super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                            .stride_list_.elems[0] * uVar9 +
                            (pmVar3->
                            super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                            ).
                            super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                            .stride_list_.elems[1] * uVar17 +
                            (pmVar3->
                            super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL>
                            ).
                            super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                            .stride_list_.elems[2] * uVar16);
        pmVar4 = this->_m_Gaoa;
        (pmVar4->
        super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>).
        super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
        .base_[(pmVar4->
               super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>)
               .
               super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
               .origin_offset_ +
               (pmVar4->
               super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>)
               .
               super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
               .stride_list_.elems[0] * uVar9 +
               (pmVar4->
               super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>)
               .
               super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
               .stride_list_.elems[1] * uVar17 +
               (pmVar4->
               super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>)
               .
               super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
               .stride_list_.elems[2] * uVar16] =
             (vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x0;
      }
    }
  }
  SoftPrintStats_abi_cxx11_((string *)&v1,this);
  poVar15 = std::operator<<((ostream *)&std::cout,(string *)&v1);
  std::endl<char,std::char_traits<char>>(poVar15);
  std::__cxx11::string::~string((string *)&v1);
  Timing::PrintSummary(this_00);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&jpol);
  AlphaVector::~AlphaVector(&alpha);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::~multi_array(&Gao);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&V);
  return __return_storage_ptr__;
}

Assistant:

QFunctionsDiscrete
QBGPlanner_TreeIncPruneBnB::BackupStage(const QFunctionsDiscrete &Qs, size_t maxNrAlphas)
{
    _m_nr_bottom_hits = 0;
    _m_nr_backtracks = 0;
    _m_nodes_visited = 0;
    _m_union_nodes_at_level = vector<LIndex>(_m_maxDepth, 0);
    _m_cs_nodes_at_level = vector<LIndex>(_m_maxDepth, 0);

    ValueFunctionPOMDPDiscrete V=QFunctionsToValueFunction(Qs);



//    vector<Index> jointActionOrder=GetJointActionOrder();

    Index nrS=GetPU()->GetNrStates(),
        nrA=GetPU()->GetNrJointActions(),
        nrO=GetPU()->GetNrJointObservations();
    cout << "TreeIncPruneBGPlanner::BackupStage computing all Gaoa vectors"; cout.flush();

    //because we will need both the POMDP vector sets as well as the QBG vector sets, 
    //we can better inline and addapt ComputeAllGaoa here
//    GaobetaVectorSet temp_Gaoa =  ComputeAllGaoa(V);
//    for(GaoVectorSetIndex a=0;a!=nrA;a++) //for each joint action
//        for(GaoVectorSetIndex o=0;o!=nrO;o++) //for each joint observation
//            for(GaoVectorSetIndex aPrime=0;aPrime!=nrA;aPrime++) //for each next joint action
//            {
//                (*_m_Gaoa_storage)[a][o][aPrime] =  VectorSetToValueFunction( *temp_Gaoa[a][o][aPrime] );
//                (*_m_Gaoa)[a][o][aPrime] =  &(*_m_Gaoa_storage)[a][o][aPrime];
//            }

    //pre-compute the back-projected POMDP vector sets
    GaoVectorSet Gao=BackProject(V);
    for(unsigned int a=0;a!=nrA;a++)
        for(unsigned int o=0;o!=nrO;o++)
        {
            VectorSet * gao = Gao[a][o];
            (*_m_Gao_storage)[a][o] = VectorSetToValueFunction( *gao );
            delete gao;
        }
    //Note we cannot prune these Gao sets, since then we do not know to which 
    //vector V[i] Gao[a][o][i] corresponds. (and we need the in order to figure
    //out what next-stage action it specifies!)
    //TODO: but we can prune them later?

    //the following allocates space for the different sets G_{a,o,\beta} (i.e., (3.15) of the QBG-techrep)
    //GaobetaVectorSet G(boost::extents[nrA][nrO][nrA]);
    //-> No: We directly add to _m_Gaoa_storage

    size_t total_number_Gaoa = 0;
    for(GaoVectorSetIndex a=0;a!=nrA;a++) //for each joint action
        for(GaoVectorSetIndex o=0;o!=nrO;o++) //for each joint observation
        {
            //instead of 
            //  for aPrime = 1:nrA
            //      for vI = 1:nrVectors
            //          if vI.GetAction = aPrime
            //we just do
            //  for vI = 1:nrVectors
            //      G[a][o][vI.GetAction].push_back( vI)

            //a pointer used to point to different vectors in Gao
            double gamma=GetPU()->GetDiscount();
            for(Index vectorI=0; vectorI!=V.size(); vectorI++) // <- for each vector in Gao[a][o]
            // ( because Gao[a][o][i] is the backprojection of V[i], this is the same as for each 
            //   vector v[vectorI] in V^t+1 )
            {
                vector<double> v_temp(GetPU()->GetNrStates());
                //add the immediate reward (which is divided equally over the vectors)
                for(Index s=0; s!=GetPU()->GetNrStates(); s++)
                {
                    double R_s_a_o = (GetPU()->GetReward(s,a)) / GetPU()->GetNrJointObservations();
                    double g_a_o_v_s =  (*_m_Gao_storage)[a][o].at(vectorI).GetValue(s);
                    v_temp.at(s) =  R_s_a_o + gamma * g_a_o_v_s;
                }
                AlphaVector v1( GetPU()->GetNrStates() );
                v1.SetValues(v_temp);
                v1.SetAction(a);
                Index aPrime = V[vectorI].GetAction(); //<- Gao does not store the next-stage actions
                (*_m_Gaoa_storage)[a][o][aPrime].push_back(v1);
            }
            //prune:
            for(Index aPrime=0; aPrime < nrA; aPrime++)
            {
#if DEBUG_QBGPlanner_TreeIncPruneBnB
                cout << "_m_Gaoa_storage[a="<<a<<"][o="<<o<<"][a'="<<aPrime<<"]  =  ";
                cout <<  SoftPrintVector( (*_m_Gaoa_storage)[a][o][aPrime] ) << endl;
#endif
                (*_m_Gaoa_storage)[a][o][aPrime] = Prune( (*_m_Gaoa_storage)[a][o][aPrime] );
                (*_m_Gaoa)[a][o][aPrime] = &((*_m_Gaoa_storage)[a][o][aPrime]);

                size_t nr = (*_m_Gaoa_storage)[a][o][aPrime].size();
#if DEBUG_QBGPlanner_TreeIncPruneBnBVerbose
                cout << "_m_Gaoa_storage[a="<<a<<"][o="<<o<<"][a'="<<aPrime<<"]  has "<<
                    nr << " vectors\n";
#endif
                total_number_Gaoa += nr;
            }
        }

    cout << " - total number of back-projected gamma vectors:" << total_number_Gaoa;
    cout << "." << endl;

    AlphaVector alpha(nrS);
   
    //TODO: could save some time by passing this in as argument (by reference) 
    QFunctionsDiscrete Q(nrA);

    // Initialize a joint policy with all individual observations
    // mapping to UNSPECIFIED_ACTION
    vector<vector<Index> > jpol;
    for(Index k=0;k!=GetPU()->GetNrAgents();++k)
    {
        vector<Index> pol(GetPU()->GetNrObservations(k),UNSPECIFIED_ACTION);
        jpol.push_back(pol);
    }

    
    //
    // About the depths: we sync the 'depth index' with the index of the 
    // joint action vector that is being specified. E.g. the 
    // union node and subsequent cross-sum node that specify the joint 
    // action for the i-th entry of the joint action vector (JAV) representation
    // (of the CBG policy beta)  are at depth i.
    //
    // So we have a tree as follows:
    // node type    depth   comments
    // union        -1      the union over joint actions a at stage t. Not explicitly represented in code.
    // cross-sum    -1      the cross-sum that adds the R^a. Not explicitly represented in code 
    //                      (because R^a vectors are divided over the Gamma_a,o,a )
    // union        0       the union over joint actions a0' to be taken for the first joint observation o0.
    // cross-sum    0       the cross-sum of G_a,o1,a1 with the union at level 1.
    // ...
    // union        k-2     ('k' is _m_maxDepth in the code and corresponds to the number of joint observations)
    // cross-sum    k-2
    // union        k-1     the (degenerate) union over the only possible joint action a{k-1}'. 
    //                      In the bottom-up (memoizer) approach it just returns G_a,o{k-1},a{k-1}'.
    // cross-sum    k-1     Only exist in the top-down approach (BnB). Then it performs the last cross-sum
    //                      (with  G_a,o{k-1},a{k-1}') to create new set of (fully specified) lower-bound vectors that
    //                      are added to L.
    //
    // !!!Attention: there is a unfortunate notation clash here. 'G' is used to denote both back-projected vectors
    // (Gaoa, Ga etc.) as well as the set of vectors that induce the 'g-function' ! (it should usually be clear from
    // context)
    //

#if REUSELOWERBOUNDS
    //if we want to use lowerbounds of previous joint actions...
    //the set of non-dominated (lower bound) vectors found so far.
    std::vector<AlphaVector> L;
#endif
    // We loop over all joint actions in the current time step
    // In BnB, this can be interpreted as a union node! (at depth - 1)
    for(Index a=0; a != nrA; a++)
    {
//#if DEBUG_QBGPlanner_TreeIncPruneBnBVerbose
        cout << "\n\n--------------------------------------\n";
        cout << "-proceeding with a="<<a<<"-------------------\n";
        cout << "--------------------------------------\n\n";
//#endif
        //the set of non-dominated (lower bound) vectors found so far.
        //(i.e., we do not prune using lowerbounds of previous joint actions)
#if ! REUSELOWERBOUNDS
        std::vector<AlphaVector> L;
#endif

        //Initialize the heuristics for this a:
        {
            stringstream ss;
            ss << "ComputePOMDPheur_ts" << GetTimeStep();
            _m_timing.Start(ss.str());
            InitializeHeuristicsForJA(a);
            _m_timing.Stop(ss.str());
        }
        cout << "Heuristic initialized" << endl;
        //The vectorset representing the implied g-function.
        //It is initialized to contain the null vector.
        std::vector<AlphaVector> G;
        AlphaVector null_vec(nrS, 0.0 );
        null_vec.SetAction(a);
        G.push_back(null_vec);

        // we don't start with CrossSum as the reward is already in Gaoa
        UnionNode(a,0,jpol, L, G);

        //TODO: check if this is not necessary:
        //L = Prune(L);

        //Frans 20111005: euhm...? this confuses me plenty. The set of vectors in L (Ga in memoization version)
        //correspond to all kind of different betaI. Really we would need to track the indices along with the
        //vectors...?!

        //AlphaVector::BGPolicyIndex betaI=-1; // NEED TO FIGURE OUT BETAI DOWN THE TREE SOMEHOW - TODO
        //Q[a]=VectorSetToValueFunction(L,a,betaI); //<- No, L now contains vectors for all actions.
#if !REUSELOWERBOUNDS
        Q[a] = L;
#endif
        //Q[a] = Prune(L);
        cout << SoftPrintStats();
    }
#if REUSELOWERBOUNDS
    //  On second though, I'm not sure if we can prune using lower bounds of other actions.
    //  (gives e.g., BackupStage finished, returning Q=
    //      < < a 0 bI -1 : values -4 -4 >, <  >, <  >, <  >, <  >, <  >, <  >, <  >, <  > >
    //  )

    //sort the vectors per action:
    for(Index lvecI=0; lvecI < L.size(); lvecI++)
    {
        AlphaVector lvec = L[lvecI];
        Index a =  lvec.GetAction();
        if (a > nrA)
        {
            stringstream ss; ss << "ERROR: action index=%d!?!" << a << endl;
            throw E(ss);
        }
        Q[ a ].push_back(lvec);
    }
#endif    

    //clean up:
    for(GaoVectorSetIndex a=0;a!=nrA;a++) //for each joint action
        for(GaoVectorSetIndex o=0;o!=nrO;o++) //for each joint observation
        {
            (*_m_Gao_storage)[a][o].clear();
            for(GaoVectorSetIndex aPrime=0;aPrime!=nrA;aPrime++) //for each next joint a
            {
                (*_m_Gaoa_storage)[a][o][aPrime].clear();
                (*_m_Gaoa)[a][o][aPrime] = 0; //not necessary I think, but shouldn't hurt
            }
        }

#if DEBUG_QBGPlanner_TreeIncPruneBnB
    cout << "BackupStage finished, returning Q=\n";
    for(Index a=0; a != nrA; a++)
        cout << "a=" << a << " - " << PrintTools::SoftPrintVector(Q[a]) << endl;
#endif
    cout << SoftPrintStats() << endl;
    
    _m_timing.PrintSummary();
    cout << endl;

    return(Q);
}